

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

message_order * __thiscall FIX::DataDictionary::getOrderedFields(DataDictionary *this)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  int *order;
  reference piVar5;
  message_order local_68;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  int *local_38;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  const_iterator iter;
  int *i;
  int *tmp;
  DataDictionary *this_local;
  
  bVar2 = message_order::operator_cast_to_bool(&this->m_orderedFieldsArray);
  if (!bVar2) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&this->m_orderedFields);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar3 + 1;
    uVar4 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    order = (int *)operator_new__(uVar4);
    iter._M_current = order;
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
    __normal_iterator(&local_30);
    local_38 = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->m_orderedFields);
    local_30._M_current = local_38;
    while( true ) {
      local_40._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end(&this->m_orderedFields);
      bVar2 = __gnu_cxx::operator!=(&local_30,&local_40);
      if (!bVar2) break;
      local_48 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator++(&local_30,0);
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      *iter._M_current = *piVar5;
      iter._M_current = iter._M_current + 1;
    }
    *iter._M_current = 0;
    message_order::message_order(&local_68,order);
    message_order::operator=(&this->m_orderedFieldsArray,&local_68);
    message_order::~message_order(&local_68);
    if (order != (int *)0x0) {
      operator_delete__(order);
    }
  }
  this_local = (DataDictionary *)&this->m_orderedFieldsArray;
  return (message_order *)this_local;
}

Assistant:

message_order const& DataDictionary::getOrderedFields() const
{
  if( m_orderedFieldsArray ) return m_orderedFieldsArray;

  int * tmp = new int[m_orderedFields.size() + 1];
  int * i = tmp;

  OrderedFields::const_iterator iter;
  for( iter = m_orderedFields.begin(); iter != m_orderedFields.end(); *(i++) = *(iter++) ) {}
  *i = 0;

  m_orderedFieldsArray = message_order(tmp);
  delete [] tmp;

  return m_orderedFieldsArray;
}